

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::GatherLayerParams::CopyFrom(GatherLayerParams *this,GatherLayerParams *from)

{
  if (from != this) {
    this->axis_ = 0;
    if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) != 0) {
      google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
                (&(this->super_MessageLite)._internal_metadata_);
    }
    MergeFrom(this,from);
    return;
  }
  return;
}

Assistant:

void GatherLayerParams::CopyFrom(const GatherLayerParams& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.GatherLayerParams)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}